

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# staleblock_test.cc
# Opt level: O1

void enter_reuse_via_separate_kvs_test(void)

{
  fdb_kvs_handle *pfVar1;
  fdb_status fVar2;
  sb_decision_t sVar3;
  size_t sVar4;
  size_t sVar5;
  int iVar6;
  fdb_doc **doc;
  uint uVar7;
  uint uVar8;
  char *__s;
  ulong uVar9;
  char *pcVar10;
  char *__s_00;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  fdb_iterator *iterator;
  fdb_doc *rdoc;
  fdb_kvs_handle *db2;
  timeval __test_begin;
  char bodybuf [512];
  fdb_kvs_config kvs_config;
  fdb_file_info file_info;
  char keybuf [256];
  fdb_config fconfig;
  fdb_kvs_handle *pfStackY_928;
  fdb_file_handle *pfStackY_920;
  fdb_kvs_config fStackY_918;
  char acStackY_900 [264];
  fdb_config fStackY_7f8;
  char acStackY_700 [520];
  fdb_doc **ppfStackY_4f8;
  size_t sStackY_4e8;
  char *pcStackY_4e0;
  char *pcStackY_4d8;
  code *pcStackY_4d0;
  fdb_kvs_handle *local_4c0;
  fdb_file_handle *local_4b8;
  fdb_iterator *local_4b0;
  fdb_doc *local_4a8;
  fdb_kvs_handle *local_4a0;
  timeval local_498;
  char local_488 [512];
  fdb_kvs_config local_288;
  fdb_file_info local_270;
  char local_228 [256];
  fdb_config local_128;
  
  pcStackY_4d0 = (code *)0x10e36a;
  gettimeofday(&local_498,(__timezone_ptr_t)0x0);
  pcStackY_4d0 = (code *)0x10e36f;
  memleak_start();
  local_4a8 = (fdb_doc *)0x0;
  pcStackY_4d0 = (code *)0x10e388;
  fdb_get_default_kvs_config();
  pcStackY_4d0 = (code *)0x10e398;
  fdb_get_default_config();
  local_128.compaction_threshold = '\0';
  local_128.block_reusing_threshold = 0x23;
  local_128.num_keeping_headers = 10;
  pcStackY_4d0 = (code *)0x10e3bf;
  system("rm -rf  staleblktest* > errorlog.txt");
  pcStackY_4d0 = (code *)0x10e3d6;
  fdb_open(&local_4b8,"./staleblktest1",&local_128);
  pcStackY_4d0 = (code *)0x10e3ed;
  fdb_kvs_open(local_4b8,&local_4c0,"db",&local_288);
  pcStackY_4d0 = (code *)0x10e404;
  fdb_kvs_open(local_4b8,&local_4a0,"db2",&local_288);
  pcVar10 = local_228;
  doc = (fdb_doc **)0x6161616161616161;
  __s_00 = local_488;
  __s = (char *)0x0;
  do {
    pcStackY_4d0 = (code *)0x10e430;
    sprintf(pcVar10,"%dkey",__s);
    pfVar1 = local_4c0;
    builtin_strncpy(local_488,"aaaaaaaaaaa",0xc);
    pcStackY_4d0 = (code *)0x10e44f;
    sVar4 = strlen(pcVar10);
    pcStackY_4d0 = (code *)0x10e45a;
    sVar5 = strlen(__s_00);
    pcStackY_4d0 = (code *)0x10e46e;
    fVar2 = fdb_set_kv(pfVar1,pcVar10,sVar4,__s_00,sVar5);
    pfVar1 = local_4a0;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      pcStackY_4d0 = (code *)0x10e779;
      enter_reuse_via_separate_kvs_test();
LAB_0010e779:
      pcStackY_4d0 = (code *)0x10e780;
      enter_reuse_via_separate_kvs_test();
LAB_0010e780:
      pcStackY_4d0 = (code *)0x10e787;
      enter_reuse_via_separate_kvs_test();
      goto LAB_0010e787;
    }
    pcStackY_4d0 = (code *)0x10e483;
    sVar4 = strlen(pcVar10);
    pcStackY_4d0 = (code *)0x10e48e;
    sVar5 = strlen(__s_00);
    pcStackY_4d0 = (code *)0x10e4a2;
    fVar2 = fdb_set_kv(pfVar1,pcVar10,sVar4,__s_00,sVar5);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e779;
    pcStackY_4d0 = (code *)0x10e4b9;
    fVar2 = fdb_commit(local_4b8,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e780;
    uVar7 = (int)__s + 1;
    __s = (char *)(ulong)uVar7;
  } while (uVar7 != 10);
  __s_00 = (char *)0x0;
  __s = local_228;
  pcVar10 = local_488;
  doc = (fdb_doc **)0x0;
  do {
    pfVar1 = local_4c0;
    builtin_strncpy(local_228,"0key",5);
    builtin_strncpy(local_488,
                    "bbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbbb"
                    ,0x80);
    pcStackY_4d0 = (code *)0x10e541;
    sVar4 = strlen(__s);
    pcStackY_4d0 = (code *)0x10e54c;
    sVar5 = strlen(pcVar10);
    pcStackY_4d0 = (code *)0x10e560;
    fVar2 = fdb_set_kv(pfVar1,__s,sVar4,pcVar10,sVar5);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e78e;
    pcStackY_4d0 = (code *)0x10e57a;
    fVar2 = fdb_get_file_info(local_4b8,&local_270);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e787;
    uVar7 = (int)doc + 1;
    doc = (fdb_doc **)(ulong)uVar7;
  } while (local_270.file_size < 0x1000000);
  pcStackY_4d0 = (code *)0x10e5a0;
  sVar3 = sb_check_block_reusing(local_4c0);
  if (sVar3 != SBD_RECLAIM) goto LAB_0010e7a1;
  pcStackY_4d0 = (code *)0x10e5b8;
  fVar2 = fdb_commit(local_4b8,'\x01');
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e7a6;
  pcVar10 = local_228;
  __s_00 = local_488;
  __s = (char *)0x0;
  do {
    pcStackY_4d0 = (code *)0x10e5e2;
    sprintf(pcVar10,"key%d",__s);
    pfVar1 = local_4c0;
    builtin_strncpy(local_488,
                    "ccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccccc"
                    ,0x80);
    pcStackY_4d0 = (code *)0x10e632;
    sVar4 = strlen(pcVar10);
    pcStackY_4d0 = (code *)0x10e63d;
    sVar5 = strlen(__s_00);
    pcStackY_4d0 = (code *)0x10e651;
    fVar2 = fdb_set_kv(pfVar1,pcVar10,sVar4,__s_00,sVar5);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e795;
    uVar8 = (int)__s + 1;
    __s = (char *)(ulong)uVar8;
  } while (uVar7 != uVar8);
  pcStackY_4d0 = (code *)0x10e672;
  fVar2 = fdb_commit(local_4b8,'\x01');
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e7ad;
  pcStackY_4d0 = (code *)0x10e69a;
  fdb_iterator_init(local_4a0,&local_4b0,(void *)0x0,0,(void *)0x0,0,0);
  __s = (char *)0xa;
  doc = &local_4a8;
  do {
    pcStackY_4d0 = (code *)0x10e6b1;
    fVar2 = fdb_iterator_get(local_4b0,doc);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e79c;
    pcStackY_4d0 = (code *)0x10e6c3;
    fdb_doc_free(local_4a8);
    local_4a8 = (fdb_doc *)0x0;
    pcStackY_4d0 = (code *)0x10e6d6;
    fVar2 = fdb_iterator_next(local_4b0);
    uVar7 = (int)__s - 1;
    __s = (char *)(ulong)uVar7;
  } while (fVar2 != FDB_RESULT_ITERATOR_FAIL);
  if (uVar7 != 0) goto LAB_0010e7b4;
  pcStackY_4d0 = (code *)0x10e6ef;
  fdb_iterator_close(local_4b0);
  pcStackY_4d0 = (code *)0x10e6f9;
  fVar2 = fdb_kvs_close(local_4c0);
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0010e7b9;
  pcStackY_4d0 = (code *)0x10e70b;
  fVar2 = fdb_kvs_close(local_4a0);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcStackY_4d0 = (code *)0x10e71d;
    fVar2 = fdb_close(local_4b8);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pcStackY_4d0 = (code *)0x10e72a;
      fdb_shutdown();
      pcStackY_4d0 = (code *)0x10e72f;
      memleak_end();
      pcVar10 = "%s PASSED\n";
      if (enter_reuse_via_separate_kvs_test()::__test_pass != '\0') {
        pcVar10 = "%s FAILED\n";
      }
      pcStackY_4d0 = (code *)0x10e760;
      fprintf(_stderr,pcVar10,"enter reuse via separate kvs test");
      return;
    }
    goto LAB_0010e7c7;
  }
  goto LAB_0010e7c0;
LAB_0010e787:
  pcStackY_4d0 = (code *)0x10e78e;
  enter_reuse_via_separate_kvs_test();
LAB_0010e78e:
  pcStackY_4d0 = (code *)0x10e795;
  enter_reuse_via_separate_kvs_test();
LAB_0010e795:
  pcStackY_4d0 = (code *)0x10e79c;
  enter_reuse_via_separate_kvs_test();
LAB_0010e79c:
  pcStackY_4d0 = (code *)0x10e7a1;
  enter_reuse_via_separate_kvs_test();
LAB_0010e7a1:
  pcStackY_4d0 = (code *)0x10e7a6;
  enter_reuse_via_separate_kvs_test();
LAB_0010e7a6:
  pcStackY_4d0 = (code *)0x10e7ad;
  enter_reuse_via_separate_kvs_test();
LAB_0010e7ad:
  pcStackY_4d0 = (code *)0x10e7b4;
  enter_reuse_via_separate_kvs_test();
LAB_0010e7b4:
  pcStackY_4d0 = (code *)0x10e7b9;
  enter_reuse_via_separate_kvs_test();
LAB_0010e7b9:
  pcStackY_4d0 = (code *)0x10e7c0;
  enter_reuse_via_separate_kvs_test();
LAB_0010e7c0:
  pcStackY_4d0 = (code *)0x10e7c7;
  enter_reuse_via_separate_kvs_test();
LAB_0010e7c7:
  pcStackY_4d0 = child_function;
  enter_reuse_via_separate_kvs_test();
  ppfStackY_4f8 = doc;
  sStackY_4e8 = sVar4;
  pcStackY_4e0 = pcVar10;
  pcStackY_4d8 = __s_00;
  pcStackY_4d0 = (code *)__s;
  fdb_get_default_kvs_config();
  fdb_get_default_config();
  fStackY_7f8.block_reusing_threshold = 0x41;
  fStackY_7f8.num_keeping_headers = 5;
  fdb_open(&pfStackY_920,"./staleblktest1",&fStackY_7f8);
  fdb_kvs_open(pfStackY_920,&pfStackY_928,"db",&fStackY_918);
  iVar6 = 0;
  uVar9 = 0;
  do {
    sprintf(acStackY_900,"key%d",uVar9);
    sprintf(acStackY_700,"seqno%d",uVar9);
    pfVar1 = pfStackY_928;
    sVar5 = strlen(acStackY_900);
    sVar4 = strlen(acStackY_700);
    fdb_set_kv(pfVar1,acStackY_900,sVar5,acStackY_700,sVar4);
    if ((int)(uVar9 / 100) * 100 + iVar6 == 0) {
      fdb_commit(pfStackY_920,(int)(uVar9 / 500) * 500 + iVar6 == 0);
    }
    uVar9 = (ulong)((int)uVar9 + 1);
    iVar6 = iVar6 + -1;
  } while( true );
}

Assistant:

void enter_reuse_via_separate_kvs_test() {
    TEST_INIT();
    memleak_start();

    int i, r, ndocs;
    int nheaders = 10;
    char keybuf[256];
    char bodybuf[512];

    fdb_status status;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db, *db2;
    fdb_doc *rdoc = NULL;
    fdb_iterator *iterator;
    sb_decision_t sb_decision;
    fdb_file_info file_info;

    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fdb_config fconfig = fdb_get_default_config();
    fconfig.compaction_threshold = 0;
    fconfig.block_reusing_threshold = 35;
    fconfig.num_keeping_headers = nheaders;

    // remove previous staleblktest files
    r = system(SHELL_DEL" staleblktest* > errorlog.txt");
    (void)r;

    fdb_open(&dbfile, "./staleblktest1", &fconfig);
    fdb_kvs_open(dbfile, &db, "db", &kvs_config);
    fdb_kvs_open(dbfile, &db2, "db2", &kvs_config);

    // load docs into db and db2
    for (i = 0; i < nheaders; i++) {
        sprintf(keybuf, "%dkey",i);
        fillstr(bodybuf, 'a', 12);
        status = fdb_set_kv(db, keybuf, strlen(keybuf),
                            bodybuf, strlen(bodybuf));
        TEST_STATUS(status);
        status = fdb_set_kv(db2, keybuf, strlen(keybuf),
                            bodybuf, strlen(bodybuf));
        TEST_STATUS(status);
        status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
        TEST_STATUS(status);
    }

    // enter reuse via db
    i = 0;
    do {
        sprintf(keybuf, "0key");
        fillstr(bodybuf, 'b', 128);
        status = fdb_set_kv(db, keybuf, strlen(keybuf),
                            bodybuf, strlen(bodybuf));
        TEST_STATUS(status);
        i++;
        status = fdb_get_file_info(dbfile, &file_info);
        TEST_STATUS(status);
    } while (file_info.file_size < SB_MIN_BLOCK_REUSING_FILESIZE);
    ndocs = i;

    sb_decision = sb_check_block_reusing(db);
    TEST_CHK(sb_decision == SBD_RECLAIM);

    // commit
    status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_STATUS(status);

    // reuse blocks
    for (i = 0; i < ndocs; i++) {
        sprintf(keybuf, "key%d", i);
        fillstr(bodybuf, 'c', 128);
        status = fdb_set_kv(db, keybuf, strlen(keybuf),
                            bodybuf, strlen(bodybuf));
        TEST_STATUS(status);
    }
    status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_STATUS(status);

    // check that docs from db2 not lost
    fdb_iterator_init(db2, &iterator, NULL, 0, NULL, 0, FDB_ITR_NONE);
    i = 0;
    do {
        status = fdb_iterator_get(iterator, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        fdb_doc_free(rdoc);
        rdoc = NULL;
        i++;
    } while (fdb_iterator_next(iterator) != FDB_RESULT_ITERATOR_FAIL);
    TEST_CHK(i==10);
    fdb_iterator_close(iterator);

    status = fdb_kvs_close(db);
    TEST_STATUS(status);
    status = fdb_kvs_close(db2);
    TEST_STATUS(status);
    status = fdb_close(dbfile);
    TEST_STATUS(status);
    fdb_shutdown();

    memleak_end();
    TEST_RESULT("enter reuse via separate kvs test");
}